

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

void QUtil::pipe_file(char *filename,Pipeline *p)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  runtime_error *this;
  allocator<char> local_2081;
  FileCloser fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2058;
  uchar buf [8192];
  
  __stream = (FILE *)safe_fopen(filename,"rb");
  fc.f = (FILE *)__stream;
  while( true ) {
    sVar2 = fread(buf,1,0x2000,__stream);
    if (sVar2 == 0) break;
    (*p->_vptr_Pipeline[2])(p,buf,sVar2);
  }
  (*p->_vptr_Pipeline[3])(p);
  iVar1 = ferror(__stream);
  if (iVar1 == 0) {
    FileCloser::~FileCloser(&fc);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2078,"failure reading file ",&local_2081);
  std::operator+(&local_2058,&local_2078,filename);
  std::runtime_error::runtime_error(this,(string *)&local_2058);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QUtil::pipe_file(char const* filename, Pipeline* p)
{
    // Exercised in test suite by testing file_provider.
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    size_t len = 0;
    int constexpr size = 8192;
    unsigned char buf[size];
    while ((len = fread(buf, 1, size, f)) > 0) {
        p->write(buf, len);
    }
    p->finish();
    if (ferror(f)) {
        throw std::runtime_error(std::string("failure reading file ") + filename);
    }
}